

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O1

void test_1d_dynamic<1ul,1ul>(void)

{
  pointer t;
  undefined8 uVar1;
  long lVar2;
  long extraout_RDX;
  value_type true_idx;
  vector<int,_std::allocator<int>_> data;
  int *local_60;
  unsigned_long local_58;
  vector<int,_std::allocator<int>_> local_50;
  int *local_38;
  
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_58 = CONCAT71(local_58._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x6d,"void test_1d_dynamic() [N = 1UL, X = 1UL]",(bool *)&local_50,(bool *)&local_58);
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_58 = CONCAT44(local_58._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x6f,"void test_1d_dynamic() [N = 1UL, X = 1UL]",(unsigned_long *)&local_50,
             (int *)&local_58);
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_58 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x71,"void test_1d_dynamic() [N = 1UL, X = 1UL]",(unsigned_long *)&local_50,&local_58)
  ;
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_58 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x72,"void test_1d_dynamic() [N = 1UL, X = 1UL]",(unsigned_long *)&local_50,&local_58)
  ;
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  local_58 = CONCAT71(local_58._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x78,"void test_1d_dynamic() [N = 1UL, X = 1UL]",(bool *)&local_50,(bool *)&local_58);
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_58 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x7a,"void test_1d_dynamic() [N = 1UL, X = 1UL]",(unsigned_long *)&local_50,&local_58)
  ;
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  local_58 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","X / N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x7c,"void test_1d_dynamic() [N = 1UL, X = 1UL]",(unsigned_long *)&local_50,&local_58)
  ;
  local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x1;
  local_58 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x7d,"void test_1d_dynamic() [N = 1UL, X = 1UL]",(unsigned_long *)&local_50,&local_58)
  ;
  local_58 = CONCAT44(local_58._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_50,1,(value_type_conflict1 *)&local_58,(allocator_type *)&local_60);
  t = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start;
  local_58 = 0;
  local_60 = (int *)0x0;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.index(i))","true_idx",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x89,"void test_1d_dynamic() [N = 1UL, X = 1UL]",(unsigned_long *)&local_60,&local_58)
  ;
  local_60 = t;
  local_38 = t + local_58;
  boost::detail::test_eq_impl<int*,int*>
            ("&(dptr[sub_l.index(i)])","&(dptr[true_idx])",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x8b,"void test_1d_dynamic() [N = 1UL, X = 1UL]",&local_60,&local_38);
  *t = 0x11;
  local_60._0_4_ = 0x11;
  boost::detail::test_eq_impl<int,int>
            ("(dptr[sub_l.index(i)])","17",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0x8f,"void test_1d_dynamic() [N = 1UL, X = 1UL]",t,(int *)&local_60);
  lVar2 = (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    local_60._0_4_ = 0x11;
    boost::detail::test_eq_impl<int,int>
              ("(data.at(sub_l.index(i)))","17",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
               ,0x92,"void test_1d_dynamic() [N = 1UL, X = 1UL]",
               local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,(int *)&local_60);
    local_60._0_4_ = 0;
    while( true ) {
      local_58 = (unsigned_long)(uint)local_60;
      boost::detail::test_eq_impl<unsigned_long,int>
                ("(l.index(i))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x98,"void test_1d_dynamic() [N = 1UL, X = 1UL]",&local_58,(int *)&local_60);
      local_58 = CONCAT44(local_58._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0x9d,"void test_1d_dynamic() [N = 1UL, X = 1UL]",t + (int)(uint)local_60,
                 (int *)&local_58);
      if ((ulong)((long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= (ulong)(long)(int)(uint)local_60)
      break;
      local_58 = CONCAT44(local_58._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(l.index(i)))","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xa0,"void test_1d_dynamic() [N = 1UL, X = 1UL]",
                 local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)(uint)local_60,(int *)&local_58);
      local_60._0_4_ = (uint)local_60 + 1;
      if ((uint)local_60 != 0) {
        if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (int *)0x0) {
          operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    lVar2 = extraout_RDX;
  }
  uVar1 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                     lVar2 >> 2);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar1);
}

Assistant:

void test_1d_dynamic()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");

    layout_mapping_right<
        dimensions<dyn>, dimensions<dyn>, dimensions<0>
    > const l{{X}, {1}, {}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    layout_mapping_right<
        dimensions<dyn>, dimensions<dyn>, dimensions<0>
    > const sub_l{{X / N}, {N}, {}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);

    BOOST_TEST_EQ((sub_l.size()), X / N);
    BOOST_TEST_EQ((sub_l.span()), X);

    // Initialize all elements to 42.
    std::vector<int> data(l[0], 42);
    int* dptr = data.data();

    // Set every Nth element to 17. 
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (s[0] * i);

        BOOST_TEST_EQ((sub_l.index(i)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i)]), 17);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i))), 17);
    }

    // Check final structure.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        // Element in the strided sub-box.
        if (0 == (i % sub_l.stepping()[0]))
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i))), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i)]), 42);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i))), 42);
        }
    }
}